

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O2

uintb __thiscall
OpBehaviorIntSext::recoverInputUnary(OpBehaviorIntSext *this,int4 sizeout,uintb out,int4 sizein)

{
  ulong uVar1;
  LowlevelError *pLVar2;
  int iVar3;
  allocator local_39;
  string local_38;
  
  if (7 < sizein) {
    sizein = 8;
  }
  uVar1 = uintbmasks[sizein];
  if (((uVar1 >> 1 ^ uVar1) & out) == 0) {
    if ((uVar1 & out) != out) {
      pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_38,"Output is not in range of sext operation",&local_39);
      LowlevelError::LowlevelError(pLVar2,&local_38);
      __cxa_throw(pLVar2,&EvaluationError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  else {
    iVar3 = 8;
    if (sizeout < 8) {
      iVar3 = sizeout;
    }
    if (((uintbmasks[iVar3] ^ uVar1) & ~out) != 0) {
      pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_38,"Output is not in range of sext operation",&local_39);
      LowlevelError::LowlevelError(pLVar2,&local_38);
      __cxa_throw(pLVar2,&EvaluationError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  return uVar1 & out;
}

Assistant:

uintb OpBehaviorIntSdiv::evaluateBinary(int4 sizeout,int4 sizein,uintb in1,uintb in2) const

{
  if (in2 == 0)
    throw EvaluationError("Divide by 0");
  intb num = in1;		// Convert to signed
  intb denom = in2;
  sign_extend(num,8*sizein-1);
  sign_extend(denom,8*sizein-1);
  intb sres = num/denom;	// Do the signed division
  zero_extend(sres,8*sizeout-1); // Cut to appropriate size
  return (uintb)sres;		// Recast as unsigned
}